

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

void __thiscall deqp::egl::anon_unknown_1::ShadersOOB::teardown(ShadersOOB *this)

{
  GLuint *pGVar1;
  GLuint *pGVar2;
  pointer puVar3;
  GLenum GVar4;
  
  if (((this->super_ContextReset).m_shaderType != SHADERTYPE_COMPUTE) &&
     (this->m_coordLocation != 0)) {
    (*((this->super_ContextReset).m_gl)->disableVertexAttribArray)(this->m_coordLocation);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,"disableVertexAttribArray(m_coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x552);
    this->m_coordLocation = 0;
  }
  if (this->m_coordinatesBuffer != 0) {
    (*((this->super_ContextReset).m_gl)->deleteBuffers)(1,&this->m_coordinatesBuffer);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,"deleteBuffers(1, &m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x559);
    this->m_coordinatesBuffer = 0;
  }
  if (this->m_isLocalArray == false) {
    pGVar1 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pGVar2 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pGVar1 != pGVar2) {
      (*((this->super_ContextReset).m_gl)->deleteBuffers)
                ((GLsizei)((ulong)((long)pGVar2 - (long)pGVar1) >> 2),pGVar1);
      GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar4,"deleteBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x561);
      puVar3 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar3) {
        (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
    }
  }
  (*((this->super_ContextReset).m_gl)->useProgram)(0);
  GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar4,"useProgram(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x566);
  return;
}

Assistant:

void ShadersOOB::teardown (void)
{
	if (m_shaderType != SHADERTYPE_COMPUTE)
	{
		if (m_coordLocation)
		{
			GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(m_coordLocation));
			m_coordLocation = 0;
		}
	}

	if (m_coordinatesBuffer)
	{
		GLU_CHECK_GLW_CALL(m_gl, deleteBuffers(1, &m_coordinatesBuffer));
		m_coordinatesBuffer = 0;
	}

	if (!m_isLocalArray)
	{
		if (!m_buffers.empty())
		{
			GLU_CHECK_GLW_CALL(m_gl, deleteBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0]));
			m_buffers.clear();
		}
	}

	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));
}